

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O2

ostream * __thiscall
dynamicgraph::SignalBase<int>::displayDependencies
          (SignalBase<int> *this,ostream *os,int param_2,string *space,string *next1,string *param_5
          )

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,(string *)space);
  poVar1 = std::operator<<(poVar1,(string *)next1);
  std::operator<<(poVar1,"-- ");
  (*this->_vptr_SignalBase[0x15])(this,os);
  return os;
}

Assistant:

virtual std::ostream &displayDependencies(std::ostream &os, const int = -1,
                                            std::string space = "",
                                            std::string next1 = "",
                                            std::string = "") const {
    os << space << next1 << "-- ";
    display(os);
    return os;
  }